

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void soul::ResolutionPass::rebuildVariableUseCounts(ModuleBase *module)

{
  undefined1 local_28 [8];
  UseCounter counter;
  UseCountResetter resetter;
  ModuleBase *module_local;
  
  rebuildVariableUseCounts::UseCountResetter::UseCountResetter
            ((UseCountResetter *)&counter.isReading);
  rebuildVariableUseCounts::UseCounter::UseCounter((UseCounter *)local_28);
  ASTVisitor::visitObject((ASTVisitor *)&counter.isReading,module);
  ASTVisitor::visitObject((ASTVisitor *)local_28,module);
  rebuildVariableUseCounts::UseCounter::~UseCounter((UseCounter *)local_28);
  rebuildVariableUseCounts::UseCountResetter::~UseCountResetter
            ((UseCountResetter *)&counter.isReading);
  return;
}

Assistant:

static void rebuildVariableUseCounts (AST::ModuleBase& module)
    {
        struct UseCountResetter  : public ASTVisitor
        {
            void visit (AST::VariableDeclaration& v) override
            {
                ASTVisitor::visit (v);
                v.numReads = 0;
                v.numWrites = 0;
            }
        };

        struct UseCounter  : public ASTVisitor
        {
            void visit (AST::Assignment& a) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = false;
                isWriting = true;
                visitObject (a.target);
                isWriting = oldWriting;
                isReading = oldReading;
                visitObject (a.newValue);
            }

            void visit (AST::PreOrPostIncOrDec& p) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = true;
                isWriting = true;
                ASTVisitor::visit (p);
                isWriting = oldWriting;
                isReading = oldReading;
            }

            void visit (AST::InPlaceOperator& o) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = true;
                isWriting = true;
                visitObject (o.target);
                isWriting = oldWriting;
                isReading = oldReading;
                visitObject (o.source);
            }

            void visit (AST::VariableRef& v) override
            {
                ASTVisitor::visit (v);

                if (isWriting)
                    v.variable->numWrites++;
                else
                    v.variable->numReads++;
            }

            void visit (AST::CallOrCast& c) override
            {
                if (c.arguments != nullptr)
                {
                    // Since we don't know if this might be a function with all pass-by-ref args, we need
                    // to mark all the args as possibly being written..
                    auto oldWriting = isWriting;
                    isWriting = true;
                    ASTVisitor::visit (c);
                    isWriting = oldWriting;
                }
            }

            void visit (AST::FunctionCall& c) override
            {
                if (c.arguments != nullptr)
                {
                    SOUL_ASSERT (c.arguments->items.size() == c.targetFunction.parameters.size());

                    // Visit the function arguments, marking them as writing if the function parameter is pass by reference
                    for (size_t i = 0; i < c.arguments->items.size(); ++i)
                    {
                        auto param = c.targetFunction.parameters[i];
                        auto oldWriting = isWriting;
                        isWriting = param->isResolved() ? param->getType().isReference() : true;
                        visitObject (c.arguments->items[i]);
                        isWriting = oldWriting;
                    }
                }
            }

            bool isReading = true, isWriting = false;
        };

        UseCountResetter resetter;
        UseCounter counter;
        resetter.visitObject (module);
        counter.visitObject (module);
    }